

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn.c
# Opt level: O0

uc_err reg_write_mips(void *_env,int mode,uint regid,void *value,size_t *size,int *setpc)

{
  uc_err local_44;
  uc_err ret;
  CPUMIPSState *env;
  int *setpc_local;
  size_t *size_local;
  void *value_local;
  uint regid_local;
  int mode_local;
  void *_env_local;
  
  local_44 = UC_ERR_ARG;
  if ((regid < 2) || (0x21 < regid)) {
    if (regid == 1) {
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      local_44 = UC_ERR_OK;
      *(undefined4 *)((long)_env + 0x80) = *value;
      *setpc = 1;
    }
    else if (regid == 0x81) {
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      local_44 = UC_ERR_OK;
      *(undefined4 *)((long)_env + 0x84) = *value;
    }
    else if (regid == 0x82) {
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      local_44 = UC_ERR_OK;
      *(undefined4 *)((long)_env + 0x94) = *value;
    }
    else if (regid == 0x89) {
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      local_44 = UC_ERR_OK;
      *(undefined4 *)((long)_env + 0x570) = *value;
    }
    else if (regid == 0x8a) {
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      local_44 = UC_ERR_OK;
      *(undefined4 *)((long)_env + 0xd4) = *value;
    }
    else if (regid == 0x8b) {
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      local_44 = UC_ERR_OK;
      *(undefined4 *)((long)_env + 0x53c) = *value;
      compute_hflags((CPUMIPSState *)_env);
    }
  }
  else {
    if (*size < 4) {
      return UC_ERR_OVERFLOW;
    }
    *size = 4;
    local_44 = UC_ERR_OK;
    *(undefined4 *)((long)_env + (ulong)(regid - 2) * 4) = *value;
  }
  return local_44;
}

Assistant:

DEFAULT_VISIBILITY
uc_err reg_write(void *_env, int mode, unsigned int regid, const void *value,
                 size_t *size, int *setpc)
{
    CPUMIPSState *env = _env;
    uc_err ret = UC_ERR_ARG;

    if (regid >= UC_MIPS_REG_0 && regid <= UC_MIPS_REG_31) {
        CHECK_REG_TYPE(mipsreg_t);
        env->active_tc.gpr[regid - UC_MIPS_REG_0] = *(mipsreg_t *)value;
    } else {
        switch (regid) {
        default:
            break;
        case UC_MIPS_REG_HI:
            CHECK_REG_TYPE(mipsreg_t);
            env->active_tc.HI[0] = *(mipsreg_t *)value;
            break;
        case UC_MIPS_REG_LO:
            CHECK_REG_TYPE(mipsreg_t);
            env->active_tc.LO[0] = *(mipsreg_t *)value;
            break;
        case UC_MIPS_REG_PC:
            CHECK_REG_TYPE(mipsreg_t);
            env->active_tc.PC = *(mipsreg_t *)value;
            *setpc = 1;
            break;
        case UC_MIPS_REG_CP0_CONFIG3:
            CHECK_REG_TYPE(mipsreg_t);
            env->CP0_Config3 = *(mipsreg_t *)value;
            break;
        case UC_MIPS_REG_CP0_STATUS:
            // TODO: ALL CP0 REGS
            // https://s3-eu-west-1.amazonaws.com/downloads-mips/documents/MD00090-2B-MIPS32PRA-AFP-06.02.pdf
            // https://s3-eu-west-1.amazonaws.com/downloads-mips/documents/MD00582-2B-microMIPS32-AFP-05.04.pdf
            CHECK_REG_TYPE(mipsreg_t);
            env->CP0_Status = *(mipsreg_t *)value;
            compute_hflags(env);
            break;
        case UC_MIPS_REG_CP0_USERLOCAL:
            CHECK_REG_TYPE(mipsreg_t);
            env->active_tc.CP0_UserLocal = *(mipsreg_t *)value;
            break;
        }
    }

    return ret;
}